

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haxx_algebra.cxx
# Opt level: O2

void __thiscall HAXX_ALGEBRA::norm::test_method(norm *this)

{
  undefined8 local_1d8;
  undefined8 local_1d0;
  double distDiff;
  double distQP;
  double distPQ;
  undefined8 local_1b0;
  double nrm;
  undefined **local_1a0;
  undefined1 local_198;
  undefined8 *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  nrm = 5.477225575051661;
  local_1b0 = 0x4015e8add236a58f;
  distPQ = 19.036935478432447;
  distQP = 19.036935478432447;
  distDiff = 10.599151866501584;
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_38 = "";
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x3d);
  local_198 = 0;
  local_1a0 = &PTR__lazy_ostream_00150bc8;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx";
  local_58 = "";
  local_190 = &boost::unit_test::lazy_ostream::inst;
  local_188 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
            (&local_1a0,&local_60,0x3d,1,2,&nrm,"nrm",&local_1b0,"nrmStupid");
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = "";
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x3e);
  local_198 = 0;
  local_1a0 = &PTR__lazy_ostream_00150bc8;
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx";
  local_88 = "";
  local_190 = &boost::unit_test::lazy_ostream::inst;
  local_188 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
            (&local_1a0,&local_90,0x3e,1,2,&distPQ,"distPQ",&distQP,"distQP");
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_98 = "";
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x3f);
  local_198 = 0;
  local_1a0 = &PTR__lazy_ostream_00150bc8;
  local_190 = &boost::unit_test::lazy_ostream::inst;
  local_188 = "";
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx";
  local_b8 = "";
  local_1d8 = 0x402532c4088fec5f;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
            (&local_1a0,&local_c0,0x3f,1,2,&distDiff,"distDiff",&local_1d8,"a*distP1Q1");
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = "";
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x41);
  local_198 = 0;
  local_1a0 = &PTR__lazy_ostream_00150bc8;
  local_1d8 = 0x3ff0000000000000;
  local_190 = &boost::unit_test::lazy_ostream::inst;
  local_188 = "";
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx";
  local_e8 = "";
  local_1d0 = 0x3ff0000000000000;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
            (&local_1a0,&local_f0,0x41,1,2,&local_1d8,"q.real()",&local_1d0,"1.");
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = "";
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x42);
  local_198 = 0;
  local_1a0 = &PTR__lazy_ostream_00150bc8;
  local_1d0 = 0x4000000000000000;
  local_190 = &boost::unit_test::lazy_ostream::inst;
  local_188 = "";
  local_1d8 = 0x4000000000000000;
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx";
  local_118 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
            (&local_1a0,&local_120,0x42,1,2,&local_1d8,"q.imag_i()",&local_1d0,"2.");
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = "";
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_130,0x43);
  local_198 = 0;
  local_1a0 = &PTR__lazy_ostream_00150bc8;
  local_1d0 = 0x4008000000000000;
  local_190 = &boost::unit_test::lazy_ostream::inst;
  local_188 = "";
  local_1d8 = 0x4008000000000000;
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx";
  local_148 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
            (&local_1a0,&local_150,0x43,1,2,&local_1d8,"q.imag_j()",&local_1d0,"3.");
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_158 = "";
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x44);
  local_198 = 0;
  local_1a0 = &PTR__lazy_ostream_00150bc8;
  local_1d8 = 0x4010000000000000;
  local_1d0 = 0x4010000000000000;
  local_190 = &boost::unit_test::lazy_ostream::inst;
  local_188 = "";
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx";
  local_178 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
            (&local_1a0,&local_180,0x44,1,2,&local_1d8,"q.imag_k()",&local_1d0,"4.");
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(norm)
{
  HAXX::quaternion<double> q(1.,2.,3.,4.);
  double nrm = HAXX::norm(q);
  double nrmStupid = 
    q.real() * q.real() +
    q.imag_i() * q.imag_i() +
    q.imag_j() * q.imag_j() +
    q.imag_k() * q.imag_k();

  nrmStupid = std::sqrt(nrmStupid);


  HAXX::quaternion<double> p(8.43,-9.3829,-10.3,3.14);
  HAXX::quaternion<double> q1(7.,2.43,3.65,7.006);
  HAXX::quaternion<double> p1(4.,2.,3.,7.);
  double a = 0.543;

  // Distance function
  double distPQ = HAXX::norm(p - q);
  double distQP = HAXX::norm(q - p);

  // Scaled distance
  double distP1Q1 = HAXX::norm(p1 + q1);
  double distDiff = HAXX::norm((p + a*p1 + q + a*q1) - (p + q));

  
  BOOST_CHECK_EQUAL(nrm,nrmStupid);
  BOOST_CHECK_EQUAL(distPQ,distQP);
  BOOST_CHECK_EQUAL(distDiff,a*distP1Q1);

  BOOST_CHECK_EQUAL(q.real(),  1.);
  BOOST_CHECK_EQUAL(q.imag_i(),2.);
  BOOST_CHECK_EQUAL(q.imag_j(),3.);
  BOOST_CHECK_EQUAL(q.imag_k(),4.);

}